

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  undefined1 in_R8B;
  string_view input;
  string local_30;
  
  (anonymous_namespace)::FieldName_abi_cxx11_(&local_30,(_anonymous_namespace_ *)this,field);
  input._M_str = (char *)0x0;
  input._M_len = (size_t)local_30._M_dataplus._M_p;
  UnderscoresToCamelCase_abi_cxx11_
            (__return_storage_ptr__,(java *)local_30._M_string_length,input,(bool)in_R8B);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(const FieldDescriptor* field) {
  return UnderscoresToCamelCase(FieldName(field), false);
}